

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void shunt_map_left(tgestate_t *state)

{
  (state->map_position).x = (state->map_position).x + '\x01';
  get_supertiles(state);
  memmove(state->tile_buf,state->tile_buf + 1,0x197);
  memmove(state->window_buf,state->window_buf + 1,0xcbf);
  plot_rightmost_tiles(state);
  return;
}

Assistant:

void shunt_map_left(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.x++;

  get_supertiles(state);

  memmove(&state->tile_buf[0], &state->tile_buf[1], TILE_BUF_LENGTH - 1);
  memmove(&state->window_buf[0], &state->window_buf[1], WINDOW_BUF_LENGTH - 1);

  plot_rightmost_tiles(state);
}